

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void node_display(ACT_NODE_t *nod)

{
  ushort **ppuVar1;
  uint *in_RDI;
  AC_PATTERN_t patt;
  act_edge *e;
  size_t j;
  undefined8 local_48;
  ulong local_40;
  undefined8 local_28;
  uint local_20;
  char *local_18;
  ulong local_10;
  uint *local_8;
  
  local_8 = in_RDI;
  printf("NODE(%3d)/....fail....> ",(ulong)*in_RDI);
  if (*(long *)(local_8 + 4) == 0) {
    printf("N.A.\n");
  }
  else {
    printf("NODE(%3d)\n",(ulong)**(uint **)(local_8 + 4));
  }
  for (local_10 = 0; local_10 < *(ulong *)(local_8 + 10); local_10 = local_10 + 1) {
    local_18 = (char *)(*(long *)(local_8 + 6) + local_10 * 0x10);
    printf("         |----(");
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)*local_18] & 0x8000) == 0) {
      printf("0x%x)",(ulong)(uint)(int)*local_18);
    }
    else {
      printf("%c)---",(ulong)(uint)(int)*local_18);
    }
    printf("--> NODE(%3d)\n",(ulong)**(uint **)(local_18 + 8));
  }
  if (*(long *)(local_8 + 0x10) != 0) {
    printf("Accepts: {");
    for (local_10 = 0; local_10 < *(ulong *)(local_8 + 0x10); local_10 = local_10 + 1) {
      memcpy(&local_48,(void *)(*(long *)(local_8 + 0xc) + local_10 * 0x30),0x30);
      if (local_10 != 0) {
        printf(", ");
      }
      if (local_20 < 2) {
        printf("%ld",local_28);
      }
      else if (local_20 == 2) {
        printf("%s",local_28);
      }
      printf(": %.*s",local_40 & 0xffffffff,local_48);
    }
    printf("}\n");
  }
  printf("\n");
  return;
}

Assistant:

void node_display (ACT_NODE_t *nod)
{
    size_t j;
    struct act_edge *e;
    AC_PATTERN_t patt;
    
    printf("NODE(%3d)/....fail....> ", nod->id);
    if (nod->failure_node)
        printf("NODE(%3d)\n", nod->failure_node->id);
    else
        printf ("N.A.\n");
    
    for (j = 0; j < nod->outgoing_size; j++)
    {
        e = &nod->outgoing[j];
        printf("         |----(");
        if(isgraph(e->alpha))
            printf("%c)---", e->alpha);
        else
            printf("0x%x)", e->alpha);
        printf("--> NODE(%3d)\n", e->next->id);
    }

    if (nod->matched_size)
    {
        printf("Accepts: {");
        for (j = 0; j < nod->matched_size; j++)
        {
            patt = nod->matched[j];
            if(j) 
                printf(", ");
            switch (patt.id.type)
            {
            case AC_PATTID_TYPE_DEFAULT:
            case AC_PATTID_TYPE_NUMBER:
                printf("%ld", patt.id.u.number);
                break;
            case AC_PATTID_TYPE_STRING:
                printf("%s", patt.id.u.stringy);
                break;
            }
            printf(": %.*s", (int)patt.ptext.length, patt.ptext.astring);
        }
        printf("}\n");
    }
    printf("\n");
}